

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall gmlc::networking::TcpServer::~TcpServer(TcpServer *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  pointer pbVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  int in_ESI;
  
  close(this,in_ESI);
  std::
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ::~vector(&this->connections);
  p_Var2 = (this->logFunction).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->logFunction,(_Any_data *)&this->logFunction,__destroy_functor);
  }
  p_Var2 = (this->errorCall).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->errorCall,(_Any_data *)&this->errorCall,__destroy_functor);
  }
  p_Var2 = (this->dataCall).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->dataCall,(_Any_data *)&this->dataCall,__destroy_functor);
  }
  pbVar3 = (this->endpoints).
           super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar3 != (pointer)0x0) {
    operator_delete(pbVar3,(long)(this->endpoints).
                                 super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar3);
  }
  std::
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ::~vector(&this->acceptors);
  p_Var4 = (this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>.
           _M_weak_this.
           super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
    }
  }
  p_Var4 = (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
           super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

TcpServer::~TcpServer()
{
    try {
        close();
    }
    catch (...) {
    }
}